

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O0

string * __thiscall
bssl::(anonymous_namespace)::CertErrorParams1SizeT::ToDebugString_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char *__lhs;
  int i;
  string local_90;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  void *local_18;
  CertErrorParams1SizeT *this_local;
  
  __lhs = *(char **)((long)this + 8);
  local_18 = this;
  this_local = (CertErrorParams1SizeT *)__return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,": ",&local_59);
  ::std::operator+(&local_38,__lhs,&local_58);
  string_util::NumberToDecimalString_abi_cxx11_
            (&local_90,(string_util *)(ulong)*(uint *)((long)this + 0x10),i);
  ::std::operator+(__return_storage_ptr__,&local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator(&local_59);
  return __return_storage_ptr__;
}

Assistant:

std::string ToDebugString() const override {
    return name_ + std::string(": ") +
           bssl::string_util::NumberToDecimalString(value_);
  }